

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c++
# Opt level: O1

Promise<kj::AuthenticatedStream> __thiscall
kj::TlsContext::wrapServer(TlsContext *this,AuthenticatedStream *stream)

{
  Disposer *pDVar1;
  PromiseArena *pPVar2;
  undefined1 auVar3 [8];
  AsyncOutputStream AVar4;
  OwnPromiseNode OVar5;
  PromiseNode *pPVar6;
  ForkHub<kj::_::Void> *pFVar7;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 aVar8;
  PromiseArena *pPVar9;
  AsyncIoStream *pAVar10;
  PromiseBase PVar11;
  void *pvVar12;
  socklen_t *in_RCX;
  Own<kj::AsyncIoStream,_std::nullptr_t> *in_RDX;
  TransformPromiseNodeBase *pTVar13;
  TransformPromiseNodeBase *this_00;
  Own<kj::TlsConnection,_std::nullptr_t> OVar14;
  Promise<void> promise;
  Own<kj::TlsConnection,_std::nullptr_t> conn;
  String peerId;
  OwnPromiseNode intermediate_1;
  undefined1 local_e0 [8];
  AsyncOutputStream local_d8;
  OwnPromiseNode local_d0;
  OwnPromiseNode local_c8;
  PromiseNode *pPStack_c0;
  AsyncIoStream *local_b8;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 local_a8;
  PromiseArena *pPStack_a0;
  Disposer *local_98;
  ForkHub<kj::_::Void> *local_90;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 local_88;
  PromiseArena *local_80;
  OwnPromiseNode local_78;
  PromiseNode *pPStack_70;
  AsyncIoStream *local_68;
  PromiseBase local_58;
  OwnPromiseNode local_50;
  SourceLocation local_48;
  
  local_a8 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)(stream->stream).ptr;
  OVar14 = heap<kj::TlsConnection,kj::Own<kj::AsyncIoStream,decltype(nullptr)>,ssl_ctx_st*>
                     ((kj *)&local_88.value,in_RDX,(ssl_ctx_st **)&local_a8);
  TlsConnection::accept((TlsConnection *)local_e0,(int)local_80,(sockaddr *)OVar14.ptr,in_RCX);
  if (*(char *)&(stream->peerIdentity).ptr == '\x01') {
    pDVar1 = (stream->peerIdentity).disposer;
    if (pDVar1 == (Disposer *)0x0) {
      local_48.fileName = (char *)0x0;
      local_a8 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
      pPStack_a0 = (PromiseArena *)0x0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_48,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_48);
    }
    (*pDVar1->_vptr_Disposer[2])(&local_d8,pDVar1,stream[1].stream.disposer);
    AVar4._vptr_AsyncOutputStream = local_d8._vptr_AsyncOutputStream;
    pPVar2 = (PromiseArena *)local_d8._vptr_AsyncOutputStream[1];
    if (pPVar2 == (PromiseArena *)0x0 ||
        (ulong)((long)local_d8._vptr_AsyncOutputStream - (long)pPVar2) < 0x28) {
      pvVar12 = operator_new(0x400);
      pTVar13 = (TransformPromiseNodeBase *)((long)pvVar12 + 0x3d8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar13,(OwnPromiseNode *)&local_d8,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++:963:66)>
                 ::anon_class_1_0_00000001_for_func::operator());
      *(undefined ***)((long)pvVar12 + 0x3d8) = &PTR_destroy_0064cdc8;
      *(void **)((long)pvVar12 + 0x3e0) = pvVar12;
    }
    else {
      local_d8._vptr_AsyncOutputStream[1] = (_func_int *)0x0;
      pTVar13 = (TransformPromiseNodeBase *)(local_d8._vptr_AsyncOutputStream + -5);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar13,(OwnPromiseNode *)&local_d8,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++:963:66)>
                 ::anon_class_1_0_00000001_for_func::operator());
      AVar4._vptr_AsyncOutputStream[-5] = (_func_int *)&PTR_destroy_0064cdc8;
      ((PromiseArenaMember *)(AVar4._vptr_AsyncOutputStream + -4))->_vptr_PromiseArenaMember =
           (_func_int **)pPVar2;
    }
    local_a8 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)&DAT_004a8171;
    pPStack_a0 = (PromiseArena *)&DAT_004a81d0;
    local_98 = (Disposer *)&DAT_4c0000058b;
    local_78.ptr = &pTVar13->super_PromiseNode;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)&local_48,&local_78,(SourceLocation *)&local_a8.value);
    OVar5.ptr = local_78.ptr;
    local_c8.ptr = (PromiseNode *)local_48.fileName;
    if ((TransformPromiseNodeBase *)local_78.ptr != (TransformPromiseNodeBase *)0x0) {
      local_78.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar5.ptr)->super_PromiseArenaMember);
    }
    local_a8 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x528f1e;
    pPStack_a0 = (PromiseArena *)0x52906a;
    local_98 = (Disposer *)0x27000003c3;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ExclusiveJoinPromiseNode,kj::_::PromiseDisposer,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::SourceLocation&>
              ((PromiseDisposer *)&local_48,&local_c8,
               (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_e0,
               (SourceLocation *)&local_a8.value);
    auVar3 = local_e0;
    local_e0 = (undefined1  [8])local_48.fileName;
    if (auVar3 != (undefined1  [8])0x0) {
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)auVar3);
    }
    OVar5.ptr = local_c8.ptr;
    if (&(local_c8.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_c8.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar5.ptr)->super_PromiseArenaMember);
    }
    AVar4._vptr_AsyncOutputStream = local_d8._vptr_AsyncOutputStream;
    if ((PromiseArenaMember *)local_d8._vptr_AsyncOutputStream != (PromiseArenaMember *)0x0) {
      local_d8._vptr_AsyncOutputStream = (_func_int **)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)AVar4._vptr_AsyncOutputStream);
    }
  }
  local_58.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
  (**((in_RDX[1].ptr)->super_AsyncInputStream)._vptr_AsyncInputStream)(&local_78);
  pPVar9 = local_80;
  aVar8 = local_88;
  auVar3 = local_e0;
  local_a8 = local_88;
  pPStack_a0 = local_80;
  local_80 = (PromiseArena *)0x0;
  pDVar1 = in_RDX[1].disposer;
  local_90 = (ForkHub<kj::_::Void> *)in_RDX[1].ptr;
  in_RDX[1].ptr = (AsyncIoStream *)0x0;
  pPVar2 = *(PromiseArena **)((long)local_e0 + 8);
  local_98 = pDVar1;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)local_e0 - (long)pPVar2) < 0x40) {
    pvVar12 = operator_new(0x400);
    pTVar13 = (TransformPromiseNodeBase *)((long)pvVar12 + 0x3c0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar13,(OwnPromiseNode *)local_e0,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++:968:23)>
               ::anon_class_32_2_93c5e707_for_func::operator());
    *(undefined ***)((long)pvVar12 + 0x3c0) = &PTR_destroy_0064ce20;
    *(anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 *)((long)pvVar12 + 0x3e0) =
         aVar8;
    *(PromiseArena **)((long)pvVar12 + 1000) = pPVar9;
    *(Disposer **)((long)pvVar12 + 0x3f0) = pDVar1;
    *(ForkHub<kj::_::Void> **)((long)pvVar12 + 0x3f8) = local_90;
    *(void **)((long)pvVar12 + 0x3c8) = pvVar12;
  }
  else {
    *(PromiseArena **)((long)local_e0 + 8) = (PromiseArena *)0x0;
    pTVar13 = (TransformPromiseNodeBase *)((long)local_e0 + -0x40);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar13,(OwnPromiseNode *)local_e0,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++:968:23)>
               ::anon_class_32_2_93c5e707_for_func::operator());
    ((PromiseArenaMember *)((long)auVar3 + -0x40))->_vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_0064ce20;
    *(anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 *)((long)auVar3 + -0x20) =
         aVar8;
    *(PromiseArena **)((long)auVar3 + -0x18) = pPVar9;
    ((PromiseArenaMember *)((long)auVar3 + -0x10))->_vptr_PromiseArenaMember = (_func_int **)pDVar1;
    *(ForkHub<kj::_::Void> **)((long)auVar3 + -8) = local_90;
    *(PromiseArena **)((long)auVar3 + -0x38) = pPVar2;
  }
  pAVar10 = local_68;
  pPVar6 = pPStack_70;
  OVar5.ptr = local_78.ptr;
  local_90 = (ForkHub<kj::_::Void> *)0x0;
  pPStack_a0 = (PromiseArena *)0x0;
  local_c8.ptr = local_78.ptr;
  pPStack_c0 = pPStack_70;
  local_b8 = local_68;
  local_78.ptr = (PromiseNode *)0x0;
  pPStack_70 = (PromiseNode *)0x0;
  pPVar2 = (pTVar13->super_PromiseNode).super_PromiseArenaMember.arena;
  local_d0.ptr = &pTVar13->super_PromiseNode;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)pTVar13 - (long)pPVar2) < 0x40) {
    pvVar12 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar12 + 0x3c0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_d0,
               kj::_::
               TransformPromiseNode<kj::AuthenticatedStream,_kj::_::IdentityFunc<kj::Promise<kj::AuthenticatedStream>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++:971:13)>
               ::anon_class_24_1_66019b5b_for_errorHandler::operator());
    *(undefined ***)((long)pvVar12 + 0x3c0) = &PTR_destroy_0064ce78;
    *(PromiseNode **)((long)pvVar12 + 1000) = OVar5.ptr;
    *(PromiseNode **)((long)pvVar12 + 0x3f0) = pPVar6;
    *(AsyncIoStream **)((long)pvVar12 + 0x3f8) = pAVar10;
    *(void **)((long)pvVar12 + 0x3c8) = pvVar12;
  }
  else {
    (pTVar13->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)0x0;
    this_00 = pTVar13 + -2;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_d0,
               kj::_::
               TransformPromiseNode<kj::AuthenticatedStream,_kj::_::IdentityFunc<kj::Promise<kj::AuthenticatedStream>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++:971:13)>
               ::anon_class_24_1_66019b5b_for_errorHandler::operator());
    pTVar13[-2].super_PromiseNode.super_PromiseArenaMember._vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_0064ce78;
    pTVar13[-1].super_PromiseNode.super_PromiseArenaMember.arena = (PromiseArena *)local_c8.ptr;
    pTVar13[-1].dependency.ptr = pPStack_c0;
    pTVar13[-1].continuationTracePtr = local_b8;
    pTVar13[-2].super_PromiseNode.super_PromiseArenaMember.arena = pPVar2;
  }
  PVar11.node.ptr = local_58.node.ptr;
  pPStack_c0 = (PromiseNode *)0x0;
  local_c8.ptr = (PromiseNode *)0x0;
  local_48.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++"
  ;
  local_48.function = "wrapServer";
  local_48.lineNumber = 0x3c8;
  local_48.columnNumber = 10;
  local_50.ptr = &this_00->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_d8,&local_50,&local_48);
  OVar5.ptr = local_50.ptr;
  *(_func_int ***)PVar11.node.ptr = local_d8._vptr_AsyncOutputStream;
  if ((TransformPromiseNodeBase *)local_50.ptr != (TransformPromiseNodeBase *)0x0) {
    local_50.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar5.ptr)->super_PromiseArenaMember);
  }
  pPVar6 = pPStack_c0;
  OVar5.ptr = local_c8.ptr;
  if ((AsyncIoStream *)local_c8.ptr != (AsyncIoStream *)0x0) {
    local_c8.ptr = (PromiseNode *)0x0;
    pPStack_c0 = (PromiseNode *)0x0;
    (**(local_b8->super_AsyncInputStream)._vptr_AsyncInputStream)
              (local_b8,OVar5.ptr,1,pPVar6,pPVar6,0);
  }
  OVar5.ptr = local_d0.ptr;
  if ((TransformPromiseNodeBase *)local_d0.ptr != (TransformPromiseNodeBase *)0x0) {
    local_d0.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar5.ptr)->super_PromiseArenaMember);
  }
  pFVar7 = local_90;
  if (local_90 != (ForkHub<kj::_::Void> *)0x0) {
    local_90 = (ForkHub<kj::_::Void> *)0x0;
    (**local_98->_vptr_Disposer)
              (local_98,(_func_int *)
                        ((long)&(pFVar7->super_ForkHubBase).super_PromiseArenaMember.
                                _vptr_PromiseArenaMember +
                        (long)(pFVar7->super_ForkHubBase).super_PromiseArenaMember.
                              _vptr_PromiseArenaMember[-2]));
  }
  pPVar2 = pPStack_a0;
  if (pPStack_a0 != (PromiseArena *)0x0) {
    pPStack_a0 = (PromiseArena *)0x0;
    (*(code *)**(undefined8 **)local_a8)
              (local_a8,(*(_func_int ***)pPVar2->bytes)[-2] + (long)pPVar2->bytes);
  }
  pPVar6 = pPStack_70;
  OVar5.ptr = local_78.ptr;
  if (local_78.ptr != (PromiseNode *)0x0) {
    local_78.ptr = (PromiseNode *)0x0;
    pPStack_70 = (PromiseNode *)0x0;
    (**(local_68->super_AsyncInputStream)._vptr_AsyncInputStream)
              (local_68,OVar5.ptr,1,pPVar6,pPVar6,0);
  }
  auVar3 = local_e0;
  if (local_e0 != (undefined1  [8])0x0) {
    local_e0 = (undefined1  [8])0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)auVar3);
  }
  pPVar2 = local_80;
  if (local_80 != (PromiseArena *)0x0) {
    local_80 = (PromiseArena *)0x0;
    (*(code *)**(undefined8 **)local_88)(local_88,(long)pPVar2 + *(long *)(*(long *)pPVar2 + -0x10))
    ;
  }
  return (Promise<kj::AuthenticatedStream>)(PromiseNode *)PVar11.node.ptr;
}

Assistant:

kj::Promise<kj::AuthenticatedStream> TlsContext::wrapServer(kj::AuthenticatedStream stream) {
  auto conn = kj::heap<TlsConnection>(kj::mv(stream.stream), reinterpret_cast<SSL_CTX*>(ctx));
  auto promise = conn->accept();
  KJ_IF_SOME(timeout, acceptTimeout) {
    promise = KJ_REQUIRE_NONNULL(timer).afterDelay(timeout).then([]() -> kj::Promise<void> {
      return KJ_EXCEPTION(DISCONNECTED, "timed out waiting for client during TLS handshake");
    }).exclusiveJoin(kj::mv(promise));
  }
  auto peerId = stream.peerIdentity->toString();
  return promise.then([conn=kj::mv(conn),innerId=kj::mv(stream.peerIdentity)]() mutable {
    auto id = conn->getIdentity(kj::mv(innerId));
    return kj::AuthenticatedStream { kj::mv(conn), kj::mv(id) };
  }).catch_([peerId=kj::mv(peerId)](kj::Exception&& e) -> kj::Promise<kj::AuthenticatedStream> {
    e.setDescription(kj::str(e.getDescription(), "; clientId = ", peerId));
    kj::throwFatalException(kj::mv(e));
  });
}